

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

ArraySubscript * new_array_subscript(void *name,void *expr)

{
  Token *pTVar1;
  void *any;
  ArraySubscript *pAVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x20);
  pAVar2 = (ArraySubscript *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node((Token *)0x0,subscript_eval);
  pTVar1 = pTVar3->token;
  (pAVar2->node).eval = pTVar3->eval;
  (pAVar2->node).token = pTVar1;
  pAVar2->name = name;
  pAVar2->expr = expr;
  return pAVar2;
}

Assistant:

ArraySubscript*  new_array_subscript(void* name, void* expr){
    ArraySubscript* term  = new(ArraySubscript);
    term->node = tree_node_(NULL, eval_handler(subscript_eval));
    term->name = name;
    term->expr = expr;
    return term;
}